

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

double __thiscall Minisat::Solver::progressEstimate(Solver *this)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  ulong uVar5;
  Size *pSVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar12 = (double)this->next_var;
  uVar1 = (this->trail_lim).sz;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 0) {
    dVar10 = 0.0;
  }
  else {
    dVar10 = 0.0;
    lVar9 = 0;
    uVar8 = 0;
    do {
      piVar3 = (this->trail_lim).data;
      iVar7 = 0;
      if (uVar8 != 0) {
        iVar7 = piVar3[uVar8 - 1];
      }
      pSVar6 = (Size *)((long)piVar3 + lVar9);
      if (uVar8 == (uVar5 & 0xffffffff)) {
        pSVar6 = &(this->trail).sz;
      }
      iVar2 = *pSVar6;
      dVar11 = pow(1.0 / dVar12,(double)(int)uVar8);
      dVar10 = dVar10 + (double)(iVar2 - iVar7) * dVar11;
      uVar5 = (ulong)(this->trail_lim).sz;
      lVar9 = lVar9 + 4;
      bVar4 = (long)uVar8 < (long)uVar5;
      uVar8 = uVar8 + 1;
    } while (bVar4);
    dVar12 = (double)this->next_var;
  }
  return dVar10 / dVar12;
}

Assistant:

double Solver::progressEstimate() const
{
    double  progress = 0;
    double  F = 1.0 / nVars();

    for (int i = 0; i <= decisionLevel(); i++){
        int beg = i == 0 ? 0 : trail_lim[i - 1];
        int end = i == decisionLevel() ? trail.size() : trail_lim[i];
        progress += pow(F, i) * (end - beg);
    }

    return progress / nVars();
}